

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pipeline_executor.cpp
# Opt level: O1

void __thiscall
duckdb::PipelineExecutor::FinishProcessing(PipelineExecutor *this,int32_t operator_idx)

{
  int32_t iVar1;
  pointer pGVar2;
  pointer pGVar3;
  unique_lock<std::mutex> guard;
  optional_ptr<duckdb::PhysicalOperator,_true> local_70;
  _Deque_base<unsigned_long,_std::allocator<unsigned_long>_> local_68;
  
  iVar1 = 0x7fffffff;
  if ((uint)operator_idx < 0x7fffffff) {
    iVar1 = operator_idx;
  }
  this->finished_processing_idx = iVar1;
  local_68._M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  local_68._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  local_68._M_impl.super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  local_68._M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  local_68._M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  local_68._M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  local_68._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  local_68._M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  local_68._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  local_68._M_impl.super__Deque_impl_data._M_map_size = 0;
  ::std::_Deque_base<unsigned_long,_std::allocator<unsigned_long>_>::_M_initialize_map(&local_68,0);
  ::std::deque<unsigned_long,_std::allocator<unsigned_long>_>::_M_move_assign1
            (&(this->in_process_operators).c,&local_68);
  ::std::_Deque_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Deque_base(&local_68);
  if ((this->pipeline->source).ptr != (PhysicalOperator *)0x0) {
    pGVar2 = unique_ptr<duckdb::GlobalSourceState,_std::default_delete<duckdb::GlobalSourceState>,_true>
             ::operator->(&this->pipeline->source_state);
    local_68._M_impl.super__Deque_impl_data._M_map =
         (_Map_pointer)&(pGVar2->super_StateWithBlockableTasks).lock;
    local_68._M_impl.super__Deque_impl_data._M_map_size =
         local_68._M_impl.super__Deque_impl_data._M_map_size & 0xffffffffffffff00;
    ::std::unique_lock<std::mutex>::lock((unique_lock<std::mutex> *)&local_68);
    local_68._M_impl.super__Deque_impl_data._M_map_size =
         CONCAT71(local_68._M_impl.super__Deque_impl_data._M_map_size._1_7_,1);
    pGVar2 = unique_ptr<duckdb::GlobalSourceState,_std::default_delete<duckdb::GlobalSourceState>,_true>
             ::operator->(&this->pipeline->source_state);
    LOCK();
    (pGVar2->super_StateWithBlockableTasks).can_block._M_base._M_i = false;
    UNLOCK();
    pGVar2 = unique_ptr<duckdb::GlobalSourceState,_std::default_delete<duckdb::GlobalSourceState>,_true>
             ::operator->(&this->pipeline->source_state);
    StateWithBlockableTasks::UnblockTasks
              (&pGVar2->super_StateWithBlockableTasks,(unique_lock<std::mutex> *)&local_68);
    ::std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)&local_68);
  }
  local_70.ptr = (this->pipeline->sink).ptr;
  if (local_70.ptr != (PhysicalOperator *)0x0) {
    optional_ptr<duckdb::PhysicalOperator,_true>::CheckValid(&local_70);
    pGVar3 = unique_ptr<duckdb::GlobalSinkState,_std::default_delete<duckdb::GlobalSinkState>,_true>
             ::operator->(&(local_70.ptr)->sink_state);
    local_68._M_impl.super__Deque_impl_data._M_map =
         (_Map_pointer)&(pGVar3->super_StateWithBlockableTasks).lock;
    local_68._M_impl.super__Deque_impl_data._M_map_size =
         local_68._M_impl.super__Deque_impl_data._M_map_size & 0xffffffffffffff00;
    ::std::unique_lock<std::mutex>::lock((unique_lock<std::mutex> *)&local_68);
    local_68._M_impl.super__Deque_impl_data._M_map_size =
         CONCAT71(local_68._M_impl.super__Deque_impl_data._M_map_size._1_7_,1);
    local_70.ptr = (this->pipeline->sink).ptr;
    optional_ptr<duckdb::PhysicalOperator,_true>::CheckValid(&local_70);
    pGVar3 = unique_ptr<duckdb::GlobalSinkState,_std::default_delete<duckdb::GlobalSinkState>,_true>
             ::operator->(&(local_70.ptr)->sink_state);
    LOCK();
    (pGVar3->super_StateWithBlockableTasks).can_block._M_base._M_i = false;
    UNLOCK();
    local_70.ptr = (this->pipeline->sink).ptr;
    optional_ptr<duckdb::PhysicalOperator,_true>::CheckValid(&local_70);
    pGVar3 = unique_ptr<duckdb::GlobalSinkState,_std::default_delete<duckdb::GlobalSinkState>,_true>
             ::operator->(&(local_70.ptr)->sink_state);
    StateWithBlockableTasks::UnblockTasks
              (&pGVar3->super_StateWithBlockableTasks,(unique_lock<std::mutex> *)&local_68);
    ::std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)&local_68);
  }
  return;
}

Assistant:

void PipelineExecutor::FinishProcessing(int32_t operator_idx) {
	finished_processing_idx = operator_idx < 0 ? NumericLimits<int32_t>::Maximum() : operator_idx;
	in_process_operators = stack<idx_t>();

	if (pipeline.GetSource()) {
		auto guard = pipeline.source_state->Lock();
		pipeline.source_state->PreventBlocking(guard);
		pipeline.source_state->UnblockTasks(guard);
	}
	if (pipeline.GetSink()) {
		auto guard = pipeline.GetSink()->sink_state->Lock();
		pipeline.GetSink()->sink_state->PreventBlocking(guard);
		pipeline.GetSink()->sink_state->UnblockTasks(guard);
	}
}